

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

bool __thiscall helics::TimeCoordinator::addDependency(TimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  value_type *in_RDI;
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  *in_stack_ffffffffffffffa8;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_ffffffffffffffc0;
  BaseTimeCoordinator *in_stack_ffffffffffffffc8;
  GlobalFederateId in_stack_ffffffffffffffd0;
  
  bVar1 = BaseTimeCoordinator::addDependency(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::lock(in_stack_ffffffffffffffa8);
    gmlc::libguarded::
    lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::operator->((lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
                  *)&stack0xffffffffffffffd0);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
              (in_stack_ffffffffffffffc0,in_RDI);
    gmlc::libguarded::
    lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::~lock_handle((lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
                    *)0x5520ac);
  }
  return bVar1;
}

Assistant:

bool TimeCoordinator::addDependency(GlobalFederateId fedID)
{
    if (BaseTimeCoordinator::addDependency(fedID)) {
        dependency_federates.lock()->push_back(fedID);
        return true;
    }
    return false;
}